

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

char * __thiscall Doublet::index(Doublet *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  
  iVar2 = GaussianOrder(&(this->left).ijk);
  iVar1 = (this->right).ijk._M_elems[2];
  iVar3 = (this->right).ijk._M_elems[1] + (this->right).ijk._M_elems[0];
  iVar4 = GaussianOrder(&(this->right).ijk);
  return (char *)(ulong)(uint)(iVar4 + iVar2 * (((iVar3 + iVar1 + 2) * (iVar1 + iVar3 + 1)) / 2));
}

Assistant:

int index(void) const { return left.index() * right.ncart() + right.index(); }